

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O0

int __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
::select_variables(solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                   *this,rc_size *sizes,int bkmin,int bkmax)

{
  bool bVar1;
  int *piVar2;
  type prVar3;
  int local_34;
  int local_30;
  int i;
  int local_28;
  int local_24;
  int bkmax_local;
  int bkmin_local;
  rc_size *sizes_local;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  *this_local;
  
  local_28 = bkmax;
  _bkmax_local = sizes;
  sizes_local = (rc_size *)this;
  if (bkmin == bkmax) {
    i = bkmin + sizes->c_size;
    local_24 = bkmin;
    piVar2 = std::min<int>(&i,&sizes->r_size);
    local_28 = *piVar2;
  }
  else {
    local_24 = sizes->c_size + bkmin;
    local_30 = bkmax + sizes->c_size;
    piVar2 = std::min<int>(&local_30,&sizes->r_size);
    local_28 = *piVar2;
    for (local_34 = local_24; local_34 <= local_28; local_34 = local_34 + 1) {
      prVar3 = std::
               unique_ptr<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
               ::operator[](&this->R,(long)local_34);
      bVar1 = stop_iterating<baryonyx::itm::minimize_tag,long_double>(prVar3->value,this->rng);
      if (bVar1) {
        return local_34 + -1;
      }
    }
  }
  this_local._4_4_ = local_28 + -1;
  return this_local._4_4_;
}

Assistant:

int select_variables(const rc_size& sizes, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin + sizes.c_size, sizes.r_size) - 1;

        bkmin += sizes.c_size;
        bkmax = std::min(bkmax + sizes.c_size, sizes.r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }